

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode::~SectionNode(SectionNode *this)

{
  undefined8 *in_RDI;
  vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_> *unaff_retaddr;
  
  *in_RDI = &PTR__SectionNode_00267938;
  std::__cxx11::string::~string((string *)(in_RDI + 0x1b));
  std::__cxx11::string::~string((string *)(in_RDI + 0x17));
  clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::~vector
            (unaff_retaddr);
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
  ::~vector((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
             *)unaff_retaddr);
  SectionStats::~SectionStats((SectionStats *)0x1c300e);
  return;
}

Assistant:

virtual ~SectionNode() = default;